

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5TermsetAdd(Fts5Termset *p,int iIdx,char *pTerm,int nTerm,int *pbPresent)

{
  int iVar1;
  Fts5TermsetEntry *pFVar2;
  ulong uVar3;
  uint uVar4;
  size_t __n;
  Fts5TermsetEntry **ppFVar5;
  int rc;
  Fts5TermsetEntry **local_38;
  
  rc = 0;
  *pbPresent = 0;
  if (p != (Fts5Termset *)0x0) {
    uVar4 = 0xd;
    for (uVar3 = (ulong)(uint)nTerm; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
      uVar4 = uVar4 * 8 ^ uVar4 ^ (int)pTerm[uVar3 - 1];
    }
    __n = (size_t)nTerm;
    ppFVar5 = p->apHash + ((uVar4 << 3 ^ iIdx ^ uVar4) & 0x1ff);
    local_38 = ppFVar5;
    while (pFVar2 = *ppFVar5, pFVar2 != (Fts5TermsetEntry *)0x0) {
      if (((pFVar2->iIdx == iIdx) && (pFVar2->nTerm == nTerm)) &&
         (iVar1 = bcmp(pFVar2->pTerm,pTerm,__n), iVar1 == 0)) {
        *pbPresent = 1;
        return rc;
      }
      ppFVar5 = &pFVar2->pNext;
    }
    pFVar2 = (Fts5TermsetEntry *)sqlite3Fts5MallocZero(&rc,__n + 0x18);
    if (pFVar2 != (Fts5TermsetEntry *)0x0) {
      pFVar2->pTerm = (char *)(pFVar2 + 1);
      pFVar2->nTerm = nTerm;
      pFVar2->iIdx = iIdx;
      memcpy(pFVar2 + 1,pTerm,__n);
      pFVar2->pNext = *local_38;
      *local_38 = pFVar2;
    }
  }
  return rc;
}

Assistant:

static int sqlite3Fts5TermsetAdd(
  Fts5Termset *p, 
  int iIdx,
  const char *pTerm, int nTerm, 
  int *pbPresent
){
  int rc = SQLITE_OK;
  *pbPresent = 0;
  if( p ){
    int i;
    u32 hash = 13;
    Fts5TermsetEntry *pEntry;

    /* Calculate a hash value for this term. This is the same hash checksum
    ** used by the fts5_hash.c module. This is not important for correct
    ** operation of the module, but is necessary to ensure that some tests
    ** designed to produce hash table collisions really do work.  */
    for(i=nTerm-1; i>=0; i--){
      hash = (hash << 3) ^ hash ^ pTerm[i];
    }
    hash = (hash << 3) ^ hash ^ iIdx;
    hash = hash % ArraySize(p->apHash);

    for(pEntry=p->apHash[hash]; pEntry; pEntry=pEntry->pNext){
      if( pEntry->iIdx==iIdx 
          && pEntry->nTerm==nTerm 
          && memcmp(pEntry->pTerm, pTerm, nTerm)==0 
      ){
        *pbPresent = 1;
        break;
      }
    }

    if( pEntry==0 ){
      pEntry = sqlite3Fts5MallocZero(&rc, sizeof(Fts5TermsetEntry) + nTerm);
      if( pEntry ){
        pEntry->pTerm = (char*)&pEntry[1];
        pEntry->nTerm = nTerm;
        pEntry->iIdx = iIdx;
        memcpy(pEntry->pTerm, pTerm, nTerm);
        pEntry->pNext = p->apHash[hash];
        p->apHash[hash] = pEntry;
      }
    }
  }

  return rc;
}